

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void __thiscall PKCS12Test_Order_Test::TestBody(PKCS12Test_Order_Test *this)

{
  allocator<x509_st_*> *paVar1;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  bool bVar2;
  char *pcVar3;
  pointer peVar4;
  pointer pxVar5;
  char *in_R9;
  allocator<x509_st_*> local_761;
  pointer local_760;
  pointer local_758;
  iterator local_750;
  size_type local_748;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_740;
  Span<const_unsigned_char> local_728;
  string local_718;
  AssertHelper local_6f8;
  Message local_6f0;
  allocator<x509_st_*> local_6e1;
  pointer local_6e0;
  pointer local_6d8;
  iterator local_6d0;
  size_type local_6c8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_6c0;
  bool local_6a1;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar__12;
  pointer local_688;
  pointer local_680;
  pointer local_678;
  iterator local_670;
  size_type local_668;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_660;
  Span<const_unsigned_char> local_648;
  string local_638;
  AssertHelper local_618;
  Message local_610;
  allocator<x509_st_*> local_601;
  pointer local_600;
  pointer local_5f8;
  pointer local_5f0;
  iterator local_5e8;
  size_type local_5e0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_5d8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__11;
  pointer local_5a0;
  iterator local_598;
  size_type local_590;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_588;
  Span<const_unsigned_char> local_570;
  string local_560;
  AssertHelper local_540;
  Message local_538;
  allocator<x509_st_*> local_529;
  pointer local_528;
  pointer local_520;
  iterator local_518;
  size_type local_510;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_508;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__10;
  pointer local_4d0;
  pointer local_4c8;
  iterator local_4c0;
  size_type local_4b8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_4b0;
  Span<const_unsigned_char> local_498;
  string local_488;
  AssertHelper local_468;
  Message local_460;
  allocator<x509_st_*> local_451;
  pointer local_450;
  pointer local_448;
  pointer local_440;
  iterator local_438;
  size_type local_430;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_428;
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__9;
  pointer local_3f0;
  pointer local_3e8;
  iterator local_3e0;
  size_type local_3d8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_3d0;
  Span<const_unsigned_char> local_3b8;
  string local_3a8;
  AssertHelper local_388;
  Message local_380;
  allocator<x509_st_*> local_371;
  pointer local_370;
  pointer local_368;
  pointer local_360;
  iterator local_358;
  size_type local_350;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_348;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__8;
  pointer local_310;
  pointer local_308;
  iterator local_300;
  size_type local_2f8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_2f0;
  Span<const_unsigned_char> local_2d8;
  string local_2c8;
  AssertHelper local_2a8;
  Message local_2a0;
  allocator<x509_st_*> local_291;
  pointer local_290;
  pointer local_288;
  pointer local_280;
  iterator local_278;
  size_type local_270;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_268;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> p12;
  AssertHelper local_200;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<X509> cert3;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<EVP_PKEY> key3;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<X509> cert2;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<EVP_PKEY> key2;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> cert1b;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<X509> cert1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key1;
  PKCS12Test_Order_Test *this_local;
  
  MakeTestKey();
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x82ffb5,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x231,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar2) {
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    MakeTestCert((EVP_PKEY *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar2) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cert1b,(internal *)local_88,(AssertionResult *)"cert1","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x233,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&cert1b);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar2) {
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      MakeTestCert((EVP_PKEY *)&gtest_ar__2.message_);
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar2) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&key2,(internal *)local_d0,(AssertionResult *)"cert1b","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x235,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&key2);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar2) {
        MakeTestKey();
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar2) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&cert2,(internal *)local_118,(AssertionResult *)0x83e6c3,"false",
                     "true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x237,pcVar3);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&cert2);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar2) {
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
          MakeTestCert((EVP_PKEY *)&gtest_ar__4.message_);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar2) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&key3,(internal *)local_160,(AssertionResult *)"cert2","false",
                       "true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x239,pcVar3);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&key3);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar2) {
            MakeTestKey();
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1a8,
                       (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar2) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&cert3,(internal *)local_1a8,(AssertionResult *)"key3","false",
                         "true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x23b,pcVar3);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&cert3);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            if (bVar2) {
              std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
              MakeTestCert((EVP_PKEY *)&gtest_ar__6.message_);
              testing::AssertionResult::
              AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                        ((AssertionResult *)local_1f0,
                         (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_,
                         (type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar2) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)
                           &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1f0,
                           (AssertionResult *)"cert3","false","true",in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x23d,pcVar3);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string
                          ((string *)
                           &p12.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                testing::Message::~Message(&local_1f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              if (bVar2) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar__7.message_);
                peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                local_290 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
                local_288 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__4.message_);
                local_280 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__6.message_);
                local_278 = &local_290;
                local_270 = 3;
                std::allocator<x509_st_*>::allocator(&local_291);
                __l_10._M_len = local_270;
                __l_10._M_array = local_278;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_268,__l_10,&local_291);
                local_249 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&gtest_ar__7.message_,peVar4,&local_268);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_248,&local_249,(type *)0x0);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_268);
                std::allocator<x509_st_*>::~allocator(&local_291);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_248);
                if (!bVar2) {
                  testing::Message::Message(&local_2a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_2c8,(internal *)local_248,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert2.get(), cert3.get()})"
                             ,"false","true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x242,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
                  testing::internal::AssertHelper::~AssertHelper(&local_2a8);
                  std::__cxx11::string::~string((string *)&local_2c8);
                  testing::Message::~Message(&local_2a0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
                if (bVar2) {
                  bssl::Span<unsigned_char_const>::
                  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((Span<unsigned_char_const> *)&local_2d8,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &gtest_ar__7.message_);
                  peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__1.message_);
                  local_310 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__4.message_);
                  local_308 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__6.message_);
                  local_300 = &local_310;
                  local_2f8 = 2;
                  paVar1 = (allocator<x509_st_*> *)
                           ((long)&gtest_ar__8.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7);
                  std::allocator<x509_st_*>::allocator(paVar1);
                  __l_09._M_len = local_2f8;
                  __l_09._M_array = local_300;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_2f0,__l_09,paVar1);
                  ExpectPKCS12Parse(local_2d8,peVar4,pxVar5,&local_2f0);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_2f0);
                  std::allocator<x509_st_*>::~allocator
                            ((allocator<x509_st_*> *)
                             ((long)&gtest_ar__8.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 7));
                  peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                      &gtest_ar_.message_);
                  local_370 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__6.message_);
                  local_368 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__1.message_);
                  local_360 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__4.message_);
                  local_358 = &local_370;
                  local_350 = 3;
                  std::allocator<x509_st_*>::allocator(&local_371);
                  __l_08._M_len = local_350;
                  __l_08._M_array = local_358;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_348,__l_08,&local_371);
                  local_329 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__7.message_,peVar4,&local_348);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_328,&local_329,(type *)0x0);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_348);
                  std::allocator<x509_st_*>::~allocator(&local_371);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_328);
                  if (!bVar2) {
                    testing::Message::Message(&local_380);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_3a8,(internal *)local_328,
                               (AssertionResult *)
                               "PKCS12CreateVector(&p12, key1.get(), {cert3.get(), cert1.get(), cert2.get()})"
                               ,"false","true",in_R9);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_388,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                               ,0x246,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_388,&local_380);
                    testing::internal::AssertHelper::~AssertHelper(&local_388);
                    std::__cxx11::string::~string((string *)&local_3a8);
                    testing::Message::~Message(&local_380);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
                  if (bVar2) {
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_3b8,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &gtest_ar__7.message_);
                    peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__1.message_);
                    local_3f0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__6.message_);
                    local_3e8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__4.message_);
                    local_3e0 = &local_3f0;
                    local_3d8 = 2;
                    paVar1 = (allocator<x509_st_*> *)
                             ((long)&gtest_ar__9.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 7);
                    std::allocator<x509_st_*>::allocator(paVar1);
                    __l_07._M_len = local_3d8;
                    __l_07._M_array = local_3e0;
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                              (&local_3d0,__l_07,paVar1);
                    ExpectPKCS12Parse(local_3b8,peVar4,pxVar5,&local_3d0);
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_3d0);
                    std::allocator<x509_st_*>::~allocator
                              ((allocator<x509_st_*> *)
                               ((long)&gtest_ar__9.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 7));
                    peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
                    local_450 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__4.message_);
                    local_448 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__6.message_);
                    local_440 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                           &gtest_ar__1.message_);
                    local_438 = &local_450;
                    local_430 = 3;
                    std::allocator<x509_st_*>::allocator(&local_451);
                    __l_06._M_len = local_430;
                    __l_06._M_array = local_438;
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                              (&local_428,__l_06,&local_451);
                    local_409 = PKCS12CreateVector((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__7.message_,peVar4,&local_428);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_408,&local_409,(type *)0x0);
                    std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_428);
                    std::allocator<x509_st_*>::~allocator(&local_451);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_408);
                    if (!bVar2) {
                      testing::Message::Message(&local_460);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_488,(internal *)local_408,
                                 (AssertionResult *)
                                 "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get(), cert1.get()})"
                                 ,"false","true",in_R9);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_468,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                                 ,0x24a,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_468,&local_460);
                      testing::internal::AssertHelper::~AssertHelper(&local_468);
                      std::__cxx11::string::~string((string *)&local_488);
                      testing::Message::~Message(&local_460);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
                    if (bVar2) {
                      bssl::Span<unsigned_char_const>::
                      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((Span<unsigned_char_const> *)&local_498,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &gtest_ar__7.message_);
                      peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__1.message_);
                      local_4d0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                             &gtest_ar__4.message_);
                      local_4c8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                             &gtest_ar__6.message_);
                      local_4c0 = &local_4d0;
                      local_4b8 = 2;
                      paVar1 = (allocator<x509_st_*> *)
                               ((long)&gtest_ar__10.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 7);
                      std::allocator<x509_st_*>::allocator(paVar1);
                      __l_05._M_len = local_4b8;
                      __l_05._M_array = local_4c0;
                      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                (&local_4b0,__l_05,paVar1);
                      ExpectPKCS12Parse(local_498,peVar4,pxVar5,&local_4b0);
                      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_4b0);
                      std::allocator<x509_st_*>::~allocator
                                ((allocator<x509_st_*> *)
                                 ((long)&gtest_ar__10.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 7));
                      peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                          &gtest_ar_.message_);
                      local_528 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                             &gtest_ar__1.message_);
                      local_520 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                             &gtest_ar__2.message_);
                      local_518 = &local_528;
                      local_510 = 2;
                      std::allocator<x509_st_*>::allocator(&local_529);
                      __l_04._M_len = local_510;
                      __l_04._M_array = local_518;
                      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                (&local_508,__l_04,&local_529);
                      local_4e9 = PKCS12CreateVector((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__7.message_,peVar4,&local_508);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
                      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_508);
                      std::allocator<x509_st_*>::~allocator(&local_529);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_4e8);
                      if (!bVar2) {
                        testing::Message::Message(&local_538);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_560,(internal *)local_4e8,
                                   (AssertionResult *)
                                   "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()})"
                                   ,"false","true",in_R9);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_540,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                                   ,0x250,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_540,&local_538);
                        testing::internal::AssertHelper::~AssertHelper(&local_540);
                        std::__cxx11::string::~string((string *)&local_560);
                        testing::Message::~Message(&local_538);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
                      if (bVar2) {
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_570,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &gtest_ar__7.message_);
                        peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                            &gtest_ar_.message_);
                        pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__2.message_);
                        local_5a0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__1.message_);
                        local_598 = &local_5a0;
                        local_590 = 1;
                        paVar1 = (allocator<x509_st_*> *)
                                 ((long)&gtest_ar__11.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 + 7);
                        std::allocator<x509_st_*>::allocator(paVar1);
                        __l_03._M_len = local_590;
                        __l_03._M_array = local_598;
                        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                  (&local_588,__l_03,paVar1);
                        ExpectPKCS12Parse(local_570,peVar4,pxVar5,&local_588);
                        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_588);
                        std::allocator<x509_st_*>::~allocator
                                  ((allocator<x509_st_*> *)
                                   ((long)&gtest_ar__11.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 7));
                        local_600 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__1.message_);
                        local_5f8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__4.message_);
                        local_5f0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                               &gtest_ar__6.message_);
                        local_5e8 = &local_600;
                        local_5e0 = 3;
                        std::allocator<x509_st_*>::allocator(&local_601);
                        __l_02._M_len = local_5e0;
                        __l_02._M_array = local_5e8;
                        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                  (&local_5d8,__l_02,&local_601);
                        local_5b9 = PKCS12CreateVector((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__7.message_,(EVP_PKEY *)0x0,&local_5d8
                                                  );
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
                        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_5d8);
                        std::allocator<x509_st_*>::~allocator(&local_601);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_5b8);
                        if (!bVar2) {
                          testing::Message::Message(&local_610);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_638,(internal *)local_5b8,
                                     (AssertionResult *)
                                     "PKCS12CreateVector(&p12, nullptr, {cert1.get(), cert2.get(), cert3.get()})"
                                     ,"false","true",in_R9);
                          pcVar3 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_618,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                                     ,0x255,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_618,&local_610);
                          testing::internal::AssertHelper::~AssertHelper(&local_618);
                          std::__cxx11::string::~string((string *)&local_638);
                          testing::Message::~Message(&local_610);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
                        if (bVar2) {
                          bssl::Span<unsigned_char_const>::
                          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ((Span<unsigned_char_const> *)&local_648,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &gtest_ar__7.message_);
                          local_688 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__1.message_);
                          local_680 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__4.message_);
                          local_678 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__6.message_);
                          local_670 = &local_688;
                          local_668 = 3;
                          paVar1 = (allocator<x509_st_*> *)
                                   ((long)&gtest_ar__12.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 7);
                          std::allocator<x509_st_*>::allocator(paVar1);
                          __l_01._M_len = local_668;
                          __l_01._M_array = local_670;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_660,__l_01,paVar1);
                          ExpectPKCS12Parse(local_648,(EVP_PKEY *)0x0,(X509 *)0x0,&local_660);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_660);
                          std::allocator<x509_st_*>::~allocator
                                    ((allocator<x509_st_*> *)
                                     ((long)&gtest_ar__12.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     + 7));
                          peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                             ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                              &gtest_ar_.message_);
                          local_6e0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__4.message_);
                          local_6d8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                 &gtest_ar__6.message_);
                          local_6d0 = &local_6e0;
                          local_6c8 = 2;
                          std::allocator<x509_st_*>::allocator(&local_6e1);
                          __l_00._M_len = local_6c8;
                          __l_00._M_array = local_6d0;
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                    (&local_6c0,__l_00,&local_6e1);
                          local_6a1 = PKCS12CreateVector((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&gtest_ar__7.message_,peVar4,&local_6c0);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_6a0,&local_6a1,(type *)0x0);
                          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_6c0);
                          std::allocator<x509_st_*>::~allocator(&local_6e1);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_6a0);
                          if (!bVar2) {
                            testing::Message::Message(&local_6f0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      (&local_718,(internal *)local_6a0,
                                       (AssertionResult *)
                                       "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()})"
                                       ,"false","true",in_R9);
                            pcVar3 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_6f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                                       ,0x25a,pcVar3);
                            testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
                            testing::internal::AssertHelper::~AssertHelper(&local_6f8);
                            std::__cxx11::string::~string((string *)&local_718);
                            testing::Message::~Message(&local_6f0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
                          if (bVar2) {
                            bssl::Span<unsigned_char_const>::
                            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ((Span<unsigned_char_const> *)&local_728,
                                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &gtest_ar__7.message_);
                            peVar4 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                                &gtest_ar_.message_);
                            local_760 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                   &gtest_ar__4.message_);
                            local_758 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                   &gtest_ar__6.message_);
                            local_750 = &local_760;
                            local_748 = 2;
                            std::allocator<x509_st_*>::allocator(&local_761);
                            __l._M_len = local_748;
                            __l._M_array = local_750;
                            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                                      (&local_740,__l,&local_761);
                            ExpectPKCS12Parse(local_728,peVar4,(X509 *)0x0,&local_740);
                            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_740);
                            std::allocator<x509_st_*>::~allocator(&local_761);
                          }
                        }
                      }
                    }
                  }
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &gtest_ar__7.message_);
              }
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__6.message_);
            }
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
          }
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
        std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(PKCS12Test, Order) {
  bssl::UniquePtr<EVP_PKEY> key1 = MakeTestKey();
  ASSERT_TRUE(key1);
  bssl::UniquePtr<X509> cert1 = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1);
  bssl::UniquePtr<X509> cert1b = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1b);
  bssl::UniquePtr<EVP_PKEY> key2 = MakeTestKey();
  ASSERT_TRUE(key2);
  bssl::UniquePtr<X509> cert2 = MakeTestCert(key2.get());
  ASSERT_TRUE(cert2);
  bssl::UniquePtr<EVP_PKEY> key3 = MakeTestKey();
  ASSERT_TRUE(key3);
  bssl::UniquePtr<X509> cert3 = MakeTestCert(key3.get());
  ASSERT_TRUE(cert3);

  // PKCS12_parse uses the key to select the main certificate.
  std::vector<uint8_t> p12;
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert3.get(), cert1.get(), cert2.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert3.get(), cert2.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert2.get(), cert3.get(), cert1.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  // In case of duplicates, the last one is selected. (It is unlikely anything
  // depends on which is selected, but we match OpenSSL.)
  ASSERT_TRUE(
      PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1b.get(), {cert1.get()});

  // If there is no key, all certificates are returned as "CA" certificates.
  ASSERT_TRUE(PKCS12CreateVector(&p12, nullptr,
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, nullptr, nullptr,
                    {cert1.get(), cert2.get(), cert3.get()});

  // The same happens if there is a key, but it does not match any certificate.
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), nullptr, {cert2.get(), cert3.get()});
}